

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O1

void __thiscall nuraft::nuraft_global_mgr::init_thread_pool(nuraft_global_mgr *this)

{
  atomic<unsigned_long> *paVar1;
  _func_int **pp_Var2;
  thread *ptVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ulong uVar6;
  ptr<worker_handle> w_hdl;
  undefined1 local_89;
  value_type local_88;
  thread *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  *local_68;
  element_type *local_60;
  nuraft_global_mgr *local_58;
  code *local_50;
  undefined8 local_48;
  nuraft_global_mgr *local_40;
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  *local_38;
  
  if ((this->config_).num_commit_threads_ != 0) {
    local_38 = &this->commit_workers_;
    local_68 = (vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
                *)&PTR___Sp_counted_ptr_inplace_00236608;
    uVar6 = 0;
    do {
      LOCK();
      paVar1 = &this->thread_id_counter_;
      pp_Var2 = (_func_int **)(paVar1->super___atomic_base<unsigned_long>)._M_i;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_88.
      super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x90);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)local_68;
      local_60 = (element_type *)(p_Var5 + 1);
      p_Var5[1]._vptr__Sp_counted_base = pp_Var2;
      p_Var5[1]._M_use_count = 0;
      p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[2]._M_weak_count = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[3]._M_weak_count = 0;
      p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      std::condition_variable::condition_variable((condition_variable *)&p_Var5[4]._M_use_count);
      p_Var5[8]._M_weak_count = 0;
      p_Var5[7]._M_use_count = 0;
      p_Var5[7]._M_weak_count = 0;
      p_Var5[8]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(undefined1 *)&p_Var5[8]._M_use_count = 0;
      local_88.
      super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_60;
      local_50 = commit_worker_loop;
      local_48 = 0;
      local_78 = (element_type *)0x0;
      local_88.
      super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      local_58 = this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::thread,std::allocator<std::thread>,void(nuraft::nuraft_global_mgr::*)(std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>),nuraft::nuraft_global_mgr*,std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>&>
                (&_Stack_70,&local_78,(allocator<std::thread> *)&local_89,(type *)&local_50,
                 &local_58,&local_88);
      _Var4._M_pi = _Stack_70._M_pi;
      ptVar3 = local_78;
      local_78 = (thread *)0x0;
      _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = ((local_88.
                 super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      ((local_88.
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr = ptVar3
      ;
      ((local_88.
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var4._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
      }
      std::
      vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
      ::push_back(local_38,&local_88);
      if (local_88.
          super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.
                   super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->config_).num_commit_threads_);
  }
  if ((this->config_).num_append_threads_ != 0) {
    local_68 = &this->append_workers_;
    local_60 = (element_type *)&PTR___Sp_counted_ptr_inplace_00236608;
    uVar6 = 0;
    local_40 = this;
    do {
      LOCK();
      paVar1 = &this->thread_id_counter_;
      pp_Var2 = (_func_int **)(paVar1->super___atomic_base<unsigned_long>)._M_i;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_88.
      super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x90);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)local_60;
      p_Var5[1]._vptr__Sp_counted_base = pp_Var2;
      p_Var5[1]._M_use_count = 0;
      p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[2]._M_weak_count = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[3]._M_weak_count = 0;
      p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      std::condition_variable::condition_variable((condition_variable *)&p_Var5[4]._M_use_count);
      this = local_40;
      p_Var5[8]._M_weak_count = 0;
      p_Var5[7]._M_use_count = 0;
      p_Var5[7]._M_weak_count = 0;
      p_Var5[8]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(undefined1 *)&p_Var5[8]._M_use_count = 0;
      local_50 = append_worker_loop;
      local_48 = 0;
      local_58 = local_40;
      local_78 = (element_type *)0x0;
      local_88.
      super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var5 + 1);
      local_88.
      super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::thread,std::allocator<std::thread>,void(nuraft::nuraft_global_mgr::*)(std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>),nuraft::nuraft_global_mgr*,std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>&>
                (&_Stack_70,&local_78,(allocator<std::thread> *)&local_89,(type *)&local_50,
                 &local_58,&local_88);
      _Var4._M_pi = _Stack_70._M_pi;
      ptVar3 = local_78;
      local_78 = (thread *)0x0;
      _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = ((local_88.
                 super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      ((local_88.
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr = ptVar3
      ;
      ((local_88.
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var4._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
      }
      std::
      vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
      ::push_back(local_68,&local_88);
      if (local_88.
          super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.
                   super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->config_).num_append_threads_);
  }
  return;
}

Assistant:

void nuraft_global_mgr::init_thread_pool() {
    for (size_t ii = 0; ii < config_.num_commit_threads_; ++ii) {
        ptr<worker_handle> w_hdl =
            cs_new<worker_handle>( thread_id_counter_.fetch_add(1) );
        w_hdl->thread_ = cs_new<std::thread>( &nuraft_global_mgr::commit_worker_loop,
                                              this,
                                              w_hdl );
        commit_workers_.push_back(w_hdl);
    }

    for (size_t ii = 0; ii < config_.num_append_threads_; ++ii) {
        ptr<worker_handle> w_hdl =
            cs_new<worker_handle>( thread_id_counter_.fetch_add(1) );
        w_hdl->thread_ = cs_new<std::thread>( &nuraft_global_mgr::append_worker_loop,
                                              this,
                                              w_hdl );
        append_workers_.push_back(w_hdl);
    }
}